

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O2

void __thiscall
EnvironmentNAVXYTHETALATTICE::ReadConfiguration(EnvironmentNAVXYTHETALATTICE *this,FILE *fCfg)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  uchar **ppuVar4;
  uchar *puVar5;
  SBPL_Exception *pSVar6;
  ostream *poVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  string sStack_9e8;
  int dTemp;
  stringstream ss;
  ostream local_9b0 [376];
  char sTemp [1024];
  char sTemp1 [1024];
  
  iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
  if (iVar2 == 1) {
    builtin_strncpy(sTemp1,"discretization(cells):",0x17);
    iVar2 = strcmp(sTemp1,sTemp);
    if (iVar2 != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar7 = std::operator<<(local_9b0,
                               "ERROR: configuration file has incorrect format (discretization)");
      poVar7 = std::operator<<(poVar7," Expected ");
      poVar7 = std::operator<<(poVar7,sTemp1);
      poVar7 = std::operator<<(poVar7," got ");
      std::operator<<(poVar7,sTemp);
      pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      SBPL_Exception::SBPL_Exception(pSVar6,&sStack_9e8);
      __cxa_throw(pSVar6,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
    if (iVar2 == 1) {
      iVar2 = atoi(sTemp);
      (this->EnvNAVXYTHETALATCfg).EnvWidth_c = iVar2;
      iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
      if (iVar2 == 1) {
        iVar2 = atoi(sTemp);
        (this->EnvNAVXYTHETALATCfg).EnvHeight_c = iVar2;
        iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
        if (iVar2 == 1) {
          builtin_strncpy(sTemp1,"NumThetaDirs:",0xe);
          iVar2 = strcmp(sTemp1,sTemp);
          if (iVar2 == 0) {
            iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
            if (iVar2 != 1) {
              pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
              SBPL_Exception::SBPL_Exception
                        (pSVar6,"ERROR: ran out of env file early (NumThetaDirs)");
              goto LAB_0012b663;
            }
            iVar2 = atoi(sTemp);
            (this->EnvNAVXYTHETALATCfg).NumThetaDirs = iVar2;
            iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
            if (iVar2 != 1) {
              pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
              SBPL_Exception::SBPL_Exception(pSVar6,"ERROR: ran out of env file early (obsthresh)");
              goto LAB_0012b663;
            }
            builtin_strncpy(sTemp1,"obsthresh:",0xb);
            iVar2 = strcmp(sTemp1,sTemp);
            if (iVar2 != 0) {
              std::__cxx11::stringstream::stringstream((stringstream *)&ss);
              poVar7 = std::operator<<(local_9b0,"ERROR: configuration file has incorrect format");
              poVar7 = std::operator<<(poVar7," Expected ");
              poVar7 = std::operator<<(poVar7,sTemp1);
              poVar7 = std::operator<<(poVar7," got ");
              poVar7 = std::operator<<(poVar7,sTemp);
              std::operator<<(poVar7,
                              " see existing examples of env files for the right format of heading")
              ;
              pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
              std::__cxx11::stringbuf::str();
              SBPL_Exception::SBPL_Exception(pSVar6,&sStack_9e8);
              __cxa_throw(pSVar6,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          else {
            builtin_strncpy(sTemp1,"obsthresh:",0xb);
            iVar2 = strcmp(sTemp1,sTemp);
            if (iVar2 != 0) {
              std::__cxx11::stringstream::stringstream((stringstream *)&ss);
              poVar7 = std::operator<<(local_9b0,"ERROR: configuration file has incorrect format");
              poVar7 = std::operator<<(poVar7," Expected ");
              poVar7 = std::operator<<(poVar7,sTemp1);
              poVar7 = std::operator<<(poVar7," got ");
              std::operator<<(poVar7,sTemp);
              pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
              std::__cxx11::stringbuf::str();
              SBPL_Exception::SBPL_Exception(pSVar6,&sStack_9e8);
              __cxa_throw(pSVar6,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
            }
            (this->EnvNAVXYTHETALATCfg).NumThetaDirs = 0x10;
          }
          iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
          if (iVar2 == 1) {
            iVar2 = atoi(sTemp);
            (this->EnvNAVXYTHETALATCfg).obsthresh = (uchar)iVar2;
            iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
            if (iVar2 == 1) {
              builtin_strncpy(sTemp1,"cost_inscribed_thresh:",0x17);
              iVar2 = strcmp(sTemp1,sTemp);
              if (iVar2 != 0) {
                std::__cxx11::stringstream::stringstream((stringstream *)&ss);
                poVar7 = std::operator<<(local_9b0,"ERROR: configuration file has incorrect format")
                ;
                poVar7 = std::operator<<(poVar7," Expected ");
                poVar7 = std::operator<<(poVar7,sTemp1);
                poVar7 = std::operator<<(poVar7," got ");
                poVar7 = std::operator<<(poVar7,sTemp);
                std::operator<<(poVar7,
                                " see existing examples of env files for the right format of heading"
                               );
                pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringbuf::str();
                SBPL_Exception::SBPL_Exception(pSVar6,&sStack_9e8);
                __cxa_throw(pSVar6,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
              }
              iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
              if (iVar2 == 1) {
                iVar2 = atoi(sTemp);
                (this->EnvNAVXYTHETALATCfg).cost_inscribed_thresh = (uchar)iVar2;
                iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
                if (iVar2 == 1) {
                  builtin_strncpy(sTemp1,"cost_possibly_circumscribed_thresh:",0x24);
                  iVar2 = strcmp(sTemp1,sTemp);
                  if (iVar2 != 0) {
                    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
                    poVar7 = std::operator<<(local_9b0,
                                             "ERROR: configuration file has incorrect format");
                    poVar7 = std::operator<<(poVar7," Expected ");
                    poVar7 = std::operator<<(poVar7,sTemp1);
                    poVar7 = std::operator<<(poVar7," got ");
                    poVar7 = std::operator<<(poVar7,sTemp);
                    std::operator<<(poVar7,
                                    " see existing examples of env files for the right format of heading"
                                   );
                    pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                    std::__cxx11::stringbuf::str();
                    SBPL_Exception::SBPL_Exception(pSVar6,&sStack_9e8);
                    __cxa_throw(pSVar6,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error)
                    ;
                  }
                  iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
                  if (iVar2 == 1) {
                    iVar2 = atoi(sTemp);
                    (this->EnvNAVXYTHETALATCfg).cost_possibly_circumscribed_thresh = iVar2;
                    iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
                    if (iVar2 == 1) {
                      builtin_strncpy(sTemp1,"cellsize(meters):",0x12);
                      iVar2 = strcmp(sTemp1,sTemp);
                      if (iVar2 != 0) {
                        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
                        poVar7 = std::operator<<(local_9b0,
                                                 "ERROR: configuration file has incorrect format");
                        poVar7 = std::operator<<(poVar7," Expected ");
                        poVar7 = std::operator<<(poVar7,sTemp1);
                        poVar7 = std::operator<<(poVar7," got ");
                        std::operator<<(poVar7,sTemp);
                        pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                        std::__cxx11::stringbuf::str();
                        SBPL_Exception::SBPL_Exception(pSVar6,&sStack_9e8);
                        __cxa_throw(pSVar6,&SBPL_Exception::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
                      if (iVar2 == 1) {
                        dVar1 = atof(sTemp);
                        (this->EnvNAVXYTHETALATCfg).cellsize_m = dVar1;
                        iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
                        if (iVar2 == 1) {
                          builtin_strncpy(sTemp1,"nominalvel(mpersecs):",0x16);
                          iVar2 = strcmp(sTemp1,sTemp);
                          if (iVar2 != 0) {
                            std::__cxx11::stringstream::stringstream((stringstream *)&ss);
                            poVar7 = std::operator<<(local_9b0,
                                                                                                          
                                                  "ERROR: configuration file has incorrect format");
                            poVar7 = std::operator<<(poVar7," Expected ");
                            poVar7 = std::operator<<(poVar7,sTemp1);
                            poVar7 = std::operator<<(poVar7," got ");
                            std::operator<<(poVar7,sTemp);
                            pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                            std::__cxx11::stringbuf::str();
                            SBPL_Exception::SBPL_Exception(pSVar6,&sStack_9e8);
                            __cxa_throw(pSVar6,&SBPL_Exception::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
                          if (iVar2 == 1) {
                            dVar1 = atof(sTemp);
                            (this->EnvNAVXYTHETALATCfg).nominalvel_mpersecs = dVar1;
                            iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
                            if (iVar2 == 1) {
                              builtin_strncpy(sTemp1,"timetoturn45degsinplace(secs):",0x1f);
                              iVar2 = strcmp(sTemp1,sTemp);
                              if (iVar2 != 0) {
                                std::__cxx11::stringstream::stringstream((stringstream *)&ss);
                                poVar7 = std::operator<<(local_9b0,
                                                                                                                  
                                                  "ERROR: configuration file has incorrect format");
                                poVar7 = std::operator<<(poVar7," Expected ");
                                poVar7 = std::operator<<(poVar7,sTemp1);
                                poVar7 = std::operator<<(poVar7," got ");
                                std::operator<<(poVar7,sTemp);
                                pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                                std::__cxx11::stringbuf::str();
                                SBPL_Exception::SBPL_Exception(pSVar6,&sStack_9e8);
                                __cxa_throw(pSVar6,&SBPL_Exception::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
                              if (iVar2 == 1) {
                                dVar1 = atof(sTemp);
                                (this->EnvNAVXYTHETALATCfg).timetoturn45degsinplace_secs = dVar1;
                                iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
                                if (iVar2 == 1) {
                                  iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
                                  if (iVar2 == 1) {
                                    dVar1 = atof(sTemp);
                                    (this->EnvNAVXYTHETALATCfg).StartX_c =
                                         (int)(dVar1 / (this->EnvNAVXYTHETALATCfg).cellsize_m) -
                                         (uint)(dVar1 < 0.0);
                                    iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
                                    if (iVar2 == 1) {
                                      dVar1 = atof(sTemp);
                                      (this->EnvNAVXYTHETALATCfg).StartY_c =
                                           (int)(dVar1 / (this->EnvNAVXYTHETALATCfg).cellsize_m) -
                                           (uint)(dVar1 < 0.0);
                                      iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
                                      if (iVar2 == 1) {
                                        dVar1 = atof(sTemp);
                                        (this->EnvNAVXYTHETALATCfg).StartTheta_rad = dVar1;
                                        iVar2 = (this->EnvNAVXYTHETALATCfg).StartX_c;
                                        if ((iVar2 < 0) ||
                                           ((this->EnvNAVXYTHETALATCfg).EnvWidth_c <= iVar2)) {
                                          pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                                          SBPL_Exception::SBPL_Exception
                                                    (pSVar6,"ERROR: illegal start coordinates");
                                        }
                                        else {
                                          iVar2 = (this->EnvNAVXYTHETALATCfg).StartY_c;
                                          if ((iVar2 < 0) ||
                                             ((this->EnvNAVXYTHETALATCfg).EnvHeight_c <= iVar2)) {
                                            pSVar6 = (SBPL_Exception *)
                                                     __cxa_allocate_exception(0x10);
                                            SBPL_Exception::SBPL_Exception
                                                      (pSVar6,"ERROR: illegal start coordinates");
                                          }
                                          else {
                                            iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
                                            if (iVar2 == 1) {
                                              iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
                                              if (iVar2 == 1) {
                                                dVar1 = atof(sTemp);
                                                (this->EnvNAVXYTHETALATCfg).EndX_c =
                                                     (int)(dVar1 / (this->EnvNAVXYTHETALATCfg).
                                                                   cellsize_m) - (uint)(dVar1 < 0.0)
                                                ;
                                                iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
                                                if (iVar2 == 1) {
                                                  dVar1 = atof(sTemp);
                                                  (this->EnvNAVXYTHETALATCfg).EndY_c =
                                                       (int)(dVar1 / (this->EnvNAVXYTHETALATCfg).
                                                                     cellsize_m) -
                                                       (uint)(dVar1 < 0.0);
                                                  iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
                                                  if (iVar2 == 1) {
                                                    dVar1 = atof(sTemp);
                                                    (this->EnvNAVXYTHETALATCfg).EndTheta_rad = dVar1
                                                    ;
                                                    iVar2 = (this->EnvNAVXYTHETALATCfg).EndX_c;
                                                    if (-1 < iVar2) {
                                                      uVar3 = (this->EnvNAVXYTHETALATCfg).EnvWidth_c
                                                      ;
                                                      if (iVar2 < (int)uVar3) {
                                                        iVar2 = (this->EnvNAVXYTHETALATCfg).EndY_c;
                                                        if ((iVar2 < 0) ||
                                                           (iVar8 = (this->EnvNAVXYTHETALATCfg).
                                                                    EnvHeight_c, iVar8 <= iVar2)) {
                                                          pSVar6 = (SBPL_Exception *)
                                                                   __cxa_allocate_exception(0x10);
                                                          SBPL_Exception::SBPL_Exception
                                                                    (pSVar6,
                                                  "ERROR: illegal end coordinates");
                                                  }
                                                  else {
                                                    if ((this->EnvNAVXYTHETALATCfg).Grid2D !=
                                                        (uchar **)0x0) {
                                                      for (lVar13 = 0;
                                                          ppuVar4 = (this->EnvNAVXYTHETALATCfg).
                                                                    Grid2D, lVar13 < (int)uVar3;
                                                          lVar13 = lVar13 + 1) {
                                                        if (ppuVar4[lVar13] != (uchar *)0x0) {
                                                          operator_delete__(ppuVar4[lVar13]);
                                                          uVar3 = (this->EnvNAVXYTHETALATCfg).
                                                                  EnvWidth_c;
                                                        }
                                                      }
                                                      if (ppuVar4 != (uchar **)0x0) {
                                                        operator_delete__(ppuVar4);
                                                        uVar3 = (this->EnvNAVXYTHETALATCfg).
                                                                EnvWidth_c;
                                                      }
                                                      (this->EnvNAVXYTHETALATCfg).Grid2D =
                                                           (uchar **)0x0;
                                                      iVar8 = (this->EnvNAVXYTHETALATCfg).
                                                              EnvHeight_c;
                                                    }
                                                    uVar12 = 0;
                                                    uVar10 = 0xffffffffffffffff;
                                                    if (-1 < (int)uVar3) {
                                                      uVar10 = (long)(int)uVar3 * 8;
                                                    }
                                                    uVar11 = (ulong)uVar3;
                                                    if ((int)uVar3 < 1) {
                                                      uVar11 = uVar12;
                                                    }
                                                    ppuVar4 = (uchar **)operator_new__(uVar10);
                                                    (this->EnvNAVXYTHETALATCfg).Grid2D = ppuVar4;
                                                    for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
                                                      puVar5 = (uchar *)operator_new__((long)iVar8);
                                                      (this->EnvNAVXYTHETALATCfg).Grid2D[uVar12] =
                                                           puVar5;
                                                    }
                                                    iVar2 = __isoc99_fscanf(fCfg,"%s",sTemp);
                                                    if (iVar2 == 1) {
                                                      lVar13 = 0;
                                                      do {
                                                        if ((this->EnvNAVXYTHETALATCfg).EnvHeight_c
                                                            <= lVar13) {
                                                          return;
                                                        }
                                                        for (lVar9 = 0;
                                                            lVar9 < (this->EnvNAVXYTHETALATCfg).
                                                                    EnvWidth_c; lVar9 = lVar9 + 1) {
                                                          iVar2 = __isoc99_fscanf(fCfg,"%d",&dTemp);
                                                          if (iVar2 != 1) {
                                                            pSVar6 = (SBPL_Exception *)
                                                                     __cxa_allocate_exception(0x10);
                                                            SBPL_Exception::SBPL_Exception
                                                                      (pSVar6,
                                                  "ERROR: incorrect format of config file");
                                                  goto LAB_0012b663;
                                                  }
                                                  (this->EnvNAVXYTHETALATCfg).Grid2D[lVar9][lVar13]
                                                       = (uchar)dTemp;
                                                  }
                                                  lVar13 = lVar13 + 1;
                                                  } while( true );
                                                  }
                                                  pSVar6 = (SBPL_Exception *)
                                                           __cxa_allocate_exception(0x10);
                                                  SBPL_Exception::SBPL_Exception
                                                            (pSVar6,
                                                  "ERROR: ran out of env file early");
                                                  }
                                                  goto LAB_0012b663;
                                                  }
                                                  }
                                                  pSVar6 = (SBPL_Exception *)
                                                           __cxa_allocate_exception(0x10);
                                                  SBPL_Exception::SBPL_Exception
                                                            (pSVar6,"ERROR: illegal end coordinates"
                                                            );
                                                  }
                                                  else {
                                                    pSVar6 = (SBPL_Exception *)
                                                             __cxa_allocate_exception(0x10);
                                                    SBPL_Exception::SBPL_Exception
                                                              (pSVar6,
                                                  "ERROR: ran out of env file early");
                                                  }
                                                }
                                                else {
                                                  pSVar6 = (SBPL_Exception *)
                                                           __cxa_allocate_exception(0x10);
                                                  SBPL_Exception::SBPL_Exception
                                                            (pSVar6,
                                                  "ERROR: ran out of env file early");
                                                }
                                              }
                                              else {
                                                pSVar6 = (SBPL_Exception *)
                                                         __cxa_allocate_exception(0x10);
                                                SBPL_Exception::SBPL_Exception
                                                          (pSVar6,"ERROR: ran out of env file early"
                                                          );
                                              }
                                            }
                                            else {
                                              pSVar6 = (SBPL_Exception *)
                                                       __cxa_allocate_exception(0x10);
                                              SBPL_Exception::SBPL_Exception
                                                        (pSVar6,"ERROR: ran out of env file early");
                                            }
                                          }
                                        }
                                      }
                                      else {
                                        pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                                        SBPL_Exception::SBPL_Exception
                                                  (pSVar6,"ERROR: ran out of env file early");
                                      }
                                    }
                                    else {
                                      pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                                      SBPL_Exception::SBPL_Exception
                                                (pSVar6,"ERROR: ran out of env file early");
                                    }
                                  }
                                  else {
                                    pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                                    SBPL_Exception::SBPL_Exception
                                              (pSVar6,"ERROR: ran out of env file early");
                                  }
                                }
                                else {
                                  pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                                  SBPL_Exception::SBPL_Exception
                                            (pSVar6,"ERROR: ran out of env file early");
                                }
                              }
                              else {
                                pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                                SBPL_Exception::SBPL_Exception
                                          (pSVar6,"ERROR: ran out of env file early");
                              }
                            }
                            else {
                              pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                              SBPL_Exception::SBPL_Exception
                                        (pSVar6,"ERROR: ran out of env file early");
                            }
                          }
                          else {
                            pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                            SBPL_Exception::SBPL_Exception
                                      (pSVar6,"ERROR: ran out of env file early");
                          }
                        }
                        else {
                          pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                          SBPL_Exception::SBPL_Exception(pSVar6,"ERROR: ran out of env file early");
                        }
                      }
                      else {
                        pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                        SBPL_Exception::SBPL_Exception(pSVar6,"ERROR: ran out of env file early");
                      }
                    }
                    else {
                      pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                      SBPL_Exception::SBPL_Exception(pSVar6,"ERROR: ran out of env file early");
                    }
                  }
                  else {
                    pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                    SBPL_Exception::SBPL_Exception(pSVar6,"ERROR: ran out of env file early");
                  }
                }
                else {
                  pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                  SBPL_Exception::SBPL_Exception(pSVar6,"ERROR: ran out of env file early");
                }
              }
              else {
                pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                SBPL_Exception::SBPL_Exception(pSVar6,"ERROR: ran out of env file early");
              }
            }
            else {
              pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
              SBPL_Exception::SBPL_Exception(pSVar6,"ERROR: ran out of env file early");
            }
          }
          else {
            pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
            SBPL_Exception::SBPL_Exception(pSVar6,"ERROR: ran out of env file early");
          }
        }
        else {
          pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
          SBPL_Exception::SBPL_Exception(pSVar6,"ERROR: ran out of env file early");
        }
      }
      else {
        pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(pSVar6,"ERROR: ran out of env file early (discretization)");
      }
    }
    else {
      pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
      SBPL_Exception::SBPL_Exception(pSVar6,"ERROR: ran out of env file early (discretization)");
    }
  }
  else {
    pSVar6 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(pSVar6,"ERROR: ran out of env file early (discretization)");
  }
LAB_0012b663:
  __cxa_throw(pSVar6,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void EnvironmentNAVXYTHETALATTICE::ReadConfiguration(FILE* fCfg)
{
    // read in the configuration of environment and initialize
    // EnvNAVXYTHETALATCfg structure
    char sTemp[1024], sTemp1[1024];
    int dTemp;
    int x, y;

    // discretization(cells)
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early (discretization)");
    }
    strcpy(sTemp1, "discretization(cells):");
    if (strcmp(sTemp1, sTemp) != 0) {
        std::stringstream ss;
        ss << "ERROR: configuration file has incorrect format (discretization)" <<
                " Expected " << sTemp1 << " got " << sTemp;
        throw SBPL_Exception(ss.str());
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early (discretization)");
    }
    EnvNAVXYTHETALATCfg.EnvWidth_c = atoi(sTemp);
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early (discretization)");
    }
    EnvNAVXYTHETALATCfg.EnvHeight_c = atoi(sTemp);

    // Scan for optional NumThetaDirs parameter. Check for following obsthresh.
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    strcpy(sTemp1, "NumThetaDirs:");
    if (strcmp(sTemp1, sTemp) != 0) {
        // optional NumThetaDirs not available; default is NAVXYTHETALAT_THETADIRS (16)
        strcpy(sTemp1, "obsthresh:");
        if (strcmp(sTemp1, sTemp) != 0) {
            std::stringstream ss;
            ss << "ERROR: configuration file has incorrect format" <<
                    " Expected " << sTemp1 << " got " << sTemp;
            throw SBPL_Exception(ss.str());
        }
        else {
            EnvNAVXYTHETALATCfg.NumThetaDirs = NAVXYTHETALAT_THETADIRS;
        }
    }
    else {
        if (fscanf(fCfg, "%s", sTemp) != 1) {
            throw SBPL_Exception("ERROR: ran out of env file early (NumThetaDirs)");
        }
        EnvNAVXYTHETALATCfg.NumThetaDirs = atoi(sTemp);

        //obsthresh:
        if (fscanf(fCfg, "%s", sTemp) != 1) {
            throw SBPL_Exception("ERROR: ran out of env file early (obsthresh)");
        }
        strcpy(sTemp1, "obsthresh:");
        if (strcmp(sTemp1, sTemp) != 0) {
            std::stringstream ss;
            ss << "ERROR: configuration file has incorrect format" <<
                " Expected " << sTemp1 << " got " << sTemp <<
                " see existing examples of env files for the right format of heading";
            throw SBPL_Exception(ss.str());
        }
    }

    // obsthresh
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.obsthresh = atoi(sTemp);
    SBPL_PRINTF("obsthresh = %d\n", EnvNAVXYTHETALATCfg.obsthresh);

    //cost_inscribed_thresh:
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    strcpy(sTemp1, "cost_inscribed_thresh:");
    if (strcmp(sTemp1, sTemp) != 0) {
        std::stringstream ss;
        ss << "ERROR: configuration file has incorrect format" <<
                " Expected " << sTemp1 << " got " << sTemp <<
                " see existing examples of env files for the right format of heading";
        throw SBPL_Exception(ss.str());
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.cost_inscribed_thresh = atoi(sTemp);
    SBPL_PRINTF("cost_inscribed_thresh = %d\n", EnvNAVXYTHETALATCfg.cost_inscribed_thresh);

    //cost_possibly_circumscribed_thresh:
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    strcpy(sTemp1, "cost_possibly_circumscribed_thresh:");
    if (strcmp(sTemp1, sTemp) != 0) {
        std::stringstream ss;
        ss << "ERROR: configuration file has incorrect format" <<
                " Expected " << sTemp1 << " got " << sTemp <<
                " see existing examples of env files for the right format of heading";
        throw SBPL_Exception(ss.str());
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.cost_possibly_circumscribed_thresh = atoi(sTemp);
    SBPL_PRINTF("cost_possibly_circumscribed_thresh = %d\n", EnvNAVXYTHETALATCfg.cost_possibly_circumscribed_thresh);

    //cellsize
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    strcpy(sTemp1, "cellsize(meters):");
    if (strcmp(sTemp1, sTemp) != 0) {
        std::stringstream ss;
        ss << "ERROR: configuration file has incorrect format" <<
                " Expected " << sTemp1 << " got " << sTemp;
        throw SBPL_Exception(ss.str());
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.cellsize_m = atof(sTemp);

    //speeds
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    strcpy(sTemp1, "nominalvel(mpersecs):");
    if (strcmp(sTemp1, sTemp) != 0) {
        std::stringstream ss;
        ss << "ERROR: configuration file has incorrect format" <<
            " Expected " << sTemp1 << " got " << sTemp;
        throw SBPL_Exception(ss.str());
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.nominalvel_mpersecs = atof(sTemp);
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    strcpy(sTemp1, "timetoturn45degsinplace(secs):");
    if (strcmp(sTemp1, sTemp) != 0) {
        std::stringstream ss;
        ss << "ERROR: configuration file has incorrect format" <<
                " Expected " << sTemp1 << " got " << sTemp;
        throw SBPL_Exception(ss.str());
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.timetoturn45degsinplace_secs = atof(sTemp);

    // start(meters,rads):
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.StartX_c = CONTXY2DISC(atof(sTemp), EnvNAVXYTHETALATCfg.cellsize_m);
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.StartY_c = CONTXY2DISC(atof(sTemp), EnvNAVXYTHETALATCfg.cellsize_m);
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }

    EnvNAVXYTHETALATCfg.StartTheta_rad = atof(sTemp);

    if (EnvNAVXYTHETALATCfg.StartX_c < 0 ||
        EnvNAVXYTHETALATCfg.StartX_c >= EnvNAVXYTHETALATCfg.EnvWidth_c)
    {
        throw SBPL_Exception("ERROR: illegal start coordinates");
    }
    if (EnvNAVXYTHETALATCfg.StartY_c < 0 ||
        EnvNAVXYTHETALATCfg.StartY_c >= EnvNAVXYTHETALATCfg.EnvHeight_c)
    {
        throw SBPL_Exception("ERROR: illegal start coordinates");
    }

    // end(meters,rads):
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.EndX_c = CONTXY2DISC(atof(sTemp), EnvNAVXYTHETALATCfg.cellsize_m);
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.EndY_c = CONTXY2DISC(atof(sTemp), EnvNAVXYTHETALATCfg.cellsize_m);
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }

    EnvNAVXYTHETALATCfg.EndTheta_rad = atof(sTemp);

    if (EnvNAVXYTHETALATCfg.EndX_c < 0 ||
        EnvNAVXYTHETALATCfg.EndX_c >= EnvNAVXYTHETALATCfg.EnvWidth_c)
    {
        throw SBPL_Exception("ERROR: illegal end coordinates");
    }
    if (EnvNAVXYTHETALATCfg.EndY_c < 0 ||
        EnvNAVXYTHETALATCfg.EndY_c >= EnvNAVXYTHETALATCfg.EnvHeight_c)
    {
        throw SBPL_Exception("ERROR: illegal end coordinates");
    }

    // unallocate the 2d environment
    if (EnvNAVXYTHETALATCfg.Grid2D != NULL) {
        for (x = 0; x < EnvNAVXYTHETALATCfg.EnvWidth_c; x++) {
            delete[] EnvNAVXYTHETALATCfg.Grid2D[x];
        }
        delete[] EnvNAVXYTHETALATCfg.Grid2D;
        EnvNAVXYTHETALATCfg.Grid2D = NULL;
    }

    // allocate the 2D environment
    EnvNAVXYTHETALATCfg.Grid2D = new unsigned char*[EnvNAVXYTHETALATCfg.EnvWidth_c];
    for (x = 0; x < EnvNAVXYTHETALATCfg.EnvWidth_c; x++) {
        EnvNAVXYTHETALATCfg.Grid2D[x] = new unsigned char[EnvNAVXYTHETALATCfg.EnvHeight_c];
    }

    // environment:
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    for (y = 0; y < EnvNAVXYTHETALATCfg.EnvHeight_c; y++) {
        for (x = 0; x < EnvNAVXYTHETALATCfg.EnvWidth_c; x++) {
            if (fscanf(fCfg, "%d", &dTemp) != 1) {
                throw SBPL_Exception("ERROR: incorrect format of config file");
            }
            EnvNAVXYTHETALATCfg.Grid2D[x][y] = dTemp;
        }
    }
}